

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O1

bool ImGui::ShowStyleSelector(char *label)

{
  bool bVar1;
  
  bVar1 = Combo(label,&ShowStyleSelector::style_idx,"Classic",-1);
  if (bVar1) {
    if (ShowStyleSelector::style_idx == 2) {
      StyleColorsLight((ImGuiStyle *)0x0);
    }
    else if (ShowStyleSelector::style_idx == 1) {
      StyleColorsDark((ImGuiStyle *)0x0);
    }
    else if (ShowStyleSelector::style_idx == 0) {
      StyleColorsClassic((ImGuiStyle *)0x0);
    }
  }
  return bVar1;
}

Assistant:

bool ImGui::ShowStyleSelector(const char* label)
{
    static int style_idx = -1;
    if (ImGui::Combo(label, &style_idx, "Classic\0Dark\0Light\0"))
    {
        switch (style_idx)
        {
        case 0: ImGui::StyleColorsClassic(); break;
        case 1: ImGui::StyleColorsDark(); break;
        case 2: ImGui::StyleColorsLight(); break;
        }
        return true;
    }
    return false;
}